

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenGlobalInitializer.cxx
# Opt level: O0

void __thiscall
cmQtAutoGenGlobalInitializer::AddToGlobalAutoGen
          (cmQtAutoGenGlobalInitializer *this,cmLocalGenerator *localGen,string *targetName)

{
  cmTarget *this_00;
  iterator name;
  string *this_01;
  bool bVar1;
  pointer ppVar2;
  cmGeneratorTarget *pcVar3;
  cmMakefile *mf;
  cmGeneratorTarget *target;
  _Self local_28;
  iterator it;
  string *targetName_local;
  cmLocalGenerator *localGen_local;
  cmQtAutoGenGlobalInitializer *this_local;
  
  it._M_node = (_Base_ptr)targetName;
  targetName_local = (string *)localGen;
  localGen_local = (cmLocalGenerator *)this;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<cmLocalGenerator_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<cmLocalGenerator_*>,_std::allocator<std::pair<cmLocalGenerator_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(&this->GlobalAutoGenTargets_,(key_type *)&targetName_local);
  target = (cmGeneratorTarget *)
           std::
           map<cmLocalGenerator_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<cmLocalGenerator_*>,_std::allocator<std::pair<cmLocalGenerator_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::end(&this->GlobalAutoGenTargets_);
  bVar1 = std::operator!=(&local_28,(_Self *)&target);
  this_01 = targetName_local;
  if (bVar1) {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<cmLocalGenerator_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_28);
    pcVar3 = cmLocalGenerator::FindGeneratorTargetToUse((cmLocalGenerator *)this_01,&ppVar2->second)
    ;
    name = it;
    if (pcVar3 != (cmGeneratorTarget *)0x0) {
      this_00 = pcVar3->Target;
      mf = cmLocalGenerator::GetMakefile((cmLocalGenerator *)targetName_local);
      cmTarget::AddUtility(this_00,(string *)name._M_node,false,mf);
    }
  }
  return;
}

Assistant:

void cmQtAutoGenGlobalInitializer::AddToGlobalAutoGen(
  cmLocalGenerator* localGen, std::string const& targetName)
{
  auto const it = this->GlobalAutoGenTargets_.find(localGen);
  if (it != this->GlobalAutoGenTargets_.end()) {
    cmGeneratorTarget const* target =
      localGen->FindGeneratorTargetToUse(it->second);
    if (target != nullptr) {
      target->Target->AddUtility(targetName, false, localGen->GetMakefile());
    }
  }
}